

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::XFormWidget::drawHandles(XFormWidget *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  Mode MVar7;
  pointer pVVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dStack_110;
  double dStack_108;
  double dStack_100;
  double dStack_f8;
  double dStack_f0;
  double dStack_e8;
  XFormWidget *pXStack_e0;
  double dStack_d8;
  XFormWidget *pXStack_d0;
  double dStack_c8;
  double dStack_c0;
  double dStack_b8;
  double dStack_b0;
  double dStack_a8;
  double dStack_a0;
  double dStack_98;
  double dStack_90;
  double dStack_88;
  double dStack_80;
  double dStack_78;
  double dStack_70;
  double dStack_68;
  double dStack_60;
  double dStack_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  double dStack_38;
  
  MVar7 = this->mode;
  if (MVar7 == Scale) {
    if ((this->target).object != (SceneObject *)0x0) {
      dStack_110 = (this->center).x;
      dStack_108 = (this->center).y;
      dStack_100 = (this->center).z;
      dVar16 = (this->bounds).max.x - (this->bounds).min.x;
      dVar17 = (this->bounds).max.y - (this->bounds).min.y;
      dVar15 = (this->bounds).max.z - (this->bounds).min.z;
      dVar15 = dVar15 * dVar15 + dVar16 * dVar16 + dVar17 * dVar17;
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      dVar15 = dVar15 * 0.5;
      glLineWidth(0x41000000);
      glBegin(1);
      dVar16 = dVar15 * 0.9;
      lVar11 = 0;
      do {
        pVVar8 = (this->axes).
                 super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dStack_f8 = *(double *)((long)&pVVar8->x + lVar11) * dVar16 + dStack_110;
        dStack_f0 = *(double *)((long)&pVVar8->y + lVar11) * dVar16 + dStack_108;
        dStack_e8 = *(double *)((long)&pVVar8->z + lVar11) * dVar16 + dStack_100;
        glColor4ubv(*(undefined8 *)
                     ((long)&(((this->axisColors).
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data + lVar11));
        glVertex3dv(&dStack_110);
        glVertex3dv(&dStack_f8);
        lVar11 = lVar11 + 0x18;
      } while (lVar11 != 0x48);
      glEnd();
      glBegin(7);
      dVar16 = dVar15 * 0.8;
      dVar15 = dVar15 * 0.5 * 0.2;
      lVar11 = 0;
      pXStack_e0 = this;
      do {
        glColor4ubv(*(undefined8 *)
                     ((long)&(((this->axisColors).
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data + lVar11));
        pVVar8 = (this->axes).
                 super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dStack_60 = *(double *)((long)&pVVar8->x + lVar11) * dVar16 + dStack_110;
        dStack_58 = *(double *)((long)&pVVar8->y + lVar11) * dVar16 + dStack_108;
        dStack_50 = *(double *)((long)&pVVar8->z + lVar11) * dVar16 + dStack_100;
        dVar17 = pVVar8[1].x;
        dVar18 = pVVar8[1].y;
        dVar1 = pVVar8[1].z;
        dVar2 = pVVar8[2].x;
        dVar3 = pVVar8[2].y;
        dVar4 = pVVar8[2].z;
        dStack_f8 = ((pVVar8->x - dVar17) - dVar2) * dVar15 + dStack_60;
        dStack_f0 = ((pVVar8->y - dVar18) - dVar3) * dVar15 + dStack_58;
        dStack_e8 = ((pVVar8->z - dVar1) - dVar4) * dVar15 + dStack_50;
        dStack_78 = ((pVVar8->x - dVar17) + dVar2) * dVar15 + dStack_60;
        dStack_70 = ((pVVar8->y - dVar18) + dVar3) * dVar15 + dStack_58;
        dStack_68 = ((pVVar8->z - dVar1) + dVar4) * dVar15 + dStack_50;
        dStack_90 = ((pVVar8->x + dVar17) - dVar2) * dVar15 + dStack_60;
        dStack_88 = ((pVVar8->y + dVar18) - dVar3) * dVar15 + dStack_58;
        dStack_80 = ((pVVar8->z + dVar1) - dVar4) * dVar15 + dStack_50;
        dStack_d8 = (pVVar8->x + dVar17 + dVar2) * dVar15 + dStack_60;
        pXStack_d0 = (XFormWidget *)((pVVar8->y + dVar18 + dVar3) * dVar15 + dStack_58);
        dStack_c8 = (pVVar8->z + dVar1 + dVar4) * dVar15 + dStack_50;
        dStack_a8 = ((-pVVar8->x - dVar17) - dVar2) * dVar15 + dStack_60;
        dStack_a0 = ((-pVVar8->y - dVar18) - dVar3) * dVar15 + dStack_58;
        dStack_98 = ((-pVVar8->z - dVar1) - dVar4) * dVar15 + dStack_50;
        dStack_48 = ((-pVVar8->x - dVar17) + dVar2) * dVar15 + dStack_60;
        dStack_40 = ((-pVVar8->y - dVar18) + dVar3) * dVar15 + dStack_58;
        dStack_38 = ((-pVVar8->z - dVar1) + dVar4) * dVar15 + dStack_50;
        dStack_c0 = ((dVar17 - pVVar8->x) - dVar2) * dVar15 + dStack_60;
        dStack_b8 = ((dVar18 - pVVar8->y) - dVar3) * dVar15 + dStack_58;
        dStack_b0 = ((dVar1 - pVVar8->z) - dVar4) * dVar15 + dStack_50;
        dStack_60 = ((dVar17 - pVVar8->x) + dVar2) * dVar15 + dStack_60;
        dStack_58 = ((dVar18 - pVVar8->y) + dVar3) * dVar15 + dStack_58;
        dStack_50 = ((dVar1 - pVVar8->z) + dVar4) * dVar15 + dStack_50;
        glVertex3dv(&dStack_f8);
        glVertex3dv(&dStack_78);
        glVertex3dv(&dStack_d8);
        glVertex3dv(&dStack_90);
        glVertex3dv(&dStack_a8);
        glVertex3dv(&dStack_48);
        glVertex3dv(&dStack_60);
        glVertex3dv(&dStack_c0);
        glVertex3dv(&dStack_f8);
        glVertex3dv(&dStack_90);
        glVertex3dv(&dStack_c0);
        glVertex3dv(&dStack_a8);
        glVertex3dv(&dStack_78);
        glVertex3dv(&dStack_d8);
        glVertex3dv(&dStack_60);
        glVertex3dv(&dStack_48);
        glVertex3dv(&dStack_f8);
        this = pXStack_e0;
        glVertex3dv(&dStack_a8);
        glVertex3dv(&dStack_48);
        glVertex3dv(&dStack_78);
        glVertex3dv(&dStack_90);
        glVertex3dv(&dStack_c0);
        glVertex3dv(&dStack_60);
        glVertex3dv(&dStack_d8);
        lVar11 = lVar11 + 0x18;
      } while (lVar11 != 0x48);
      glEnd();
      drawCenterHandle(this);
      glLineWidth(0x3f800000);
    }
    return;
  }
  if (MVar7 != Rotate) {
    if (MVar7 != Translate) {
      return;
    }
    if ((this->target).object != (SceneObject *)0x0) {
      bVar5 = this->objectMode;
      bVar6 = this->transformedMode;
      dStack_e8 = (this->center).x;
      pXStack_e0 = (XFormWidget *)(this->center).y;
      dStack_d8 = (this->center).z;
      dVar16 = (this->bounds).max.x - (this->bounds).min.x;
      dVar17 = (this->bounds).max.y - (this->bounds).min.y;
      dVar15 = (this->bounds).max.z - (this->bounds).min.z;
      dVar15 = dVar15 * dVar15 + dVar16 * dVar16 + dVar17 * dVar17;
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      dVar15 = dVar15 * 0.5;
      glLineWidth(0x41000000);
      glBegin(1);
      dVar16 = dVar15 * 0.85;
      uVar12 = 0;
      if (bVar6 != false) {
        uVar12 = (ulong)(((byte)~bVar5 & 1) * 2);
      }
      lVar11 = (ulong)(uint)((int)uVar12 * 8) * 3;
      do {
        pVVar8 = (this->axes).
                 super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dStack_90 = *(double *)((long)&pVVar8->x + lVar11) * dVar16 + dStack_e8;
        dStack_88 = *(double *)((long)&pVVar8->y + lVar11) * dVar16 + (double)pXStack_e0;
        dStack_80 = *(double *)((long)&pVVar8->z + lVar11) * dVar16 + dStack_d8;
        glColor4ubv(*(undefined8 *)
                     ((long)&(((this->axisColors).
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data + lVar11));
        glVertex3dv(&dStack_e8);
        glVertex3dv(&dStack_90);
        lVar11 = lVar11 + 0x18;
      } while (lVar11 != 0x48);
      pXStack_d0 = this;
      glEnd();
      glBegin(4);
      dStack_78 = dVar15 * 0.5 * 0.15;
      do {
        pVVar8 = (pXStack_d0->axes).
                 super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dStack_90 = pVVar8[uVar12].x * dVar15 + dStack_e8;
        dStack_88 = pVVar8[uVar12].y * dVar15 + (double)pXStack_e0;
        dStack_80 = pVVar8[uVar12].z * dVar15 + dStack_d8;
        dStack_100 = pVVar8[uVar12].x * dVar16 + dStack_e8;
        dStack_f8 = pVVar8[uVar12].y * dVar16 + (double)pXStack_e0;
        dStack_f0 = pVVar8[uVar12].z * dVar16 + dStack_d8;
        uVar13 = uVar12 + 1;
        uVar14 = uVar13 & 0xffffffff;
        if (uVar13 == 3) {
          uVar14 = 0;
        }
        dStack_a0 = pVVar8[uVar14].x * dStack_78;
        dStack_a8 = pVVar8[uVar14].y * dStack_78;
        dStack_b0 = pVVar8[uVar14].z * dStack_78;
        uVar9 = ((int)uVar12 + 2U) % 3;
        dStack_b8 = pVVar8[uVar9].x * dStack_78;
        dStack_c0 = pVVar8[uVar9].y * dStack_78;
        dStack_c8 = pVVar8[uVar9].z * dStack_78;
        glColor4ubv((pXStack_d0->axisColors).
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar12].
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
        dStack_68 = 0.0;
        iVar10 = 1;
        do {
          dStack_108 = dStack_68 * 6.283185307179586 * 0.125;
          dStack_68 = dStack_68 + 1.0;
          dStack_98 = (double)iVar10 * 6.283185307179586 * 0.125;
          dVar17 = cos(dStack_108);
          dStack_70 = dStack_a0 * dVar17 + dStack_100;
          dVar18 = dStack_a8 * dVar17 + dStack_f8;
          dStack_110 = dVar17 * dStack_b0 + dStack_f0;
          dVar17 = sin(dStack_108);
          dStack_48 = dStack_70 - dStack_b8 * dVar17;
          dStack_40 = dVar18 - dStack_c0 * dVar17;
          dStack_38 = dStack_110 - dVar17 * dStack_c8;
          dVar17 = cos(dStack_98);
          dVar18 = dStack_a0 * dVar17 + dStack_100;
          dStack_110 = dStack_a8 * dVar17 + dStack_f8;
          dStack_108 = dVar17 * dStack_b0 + dStack_f0;
          dVar17 = sin(dStack_98);
          dStack_60 = dVar18 - dStack_b8 * dVar17;
          dStack_58 = dStack_110 - dStack_c0 * dVar17;
          dStack_50 = dStack_108 - dVar17 * dStack_c8;
          glVertex3dv(&dStack_90);
          glVertex3dv(&dStack_48);
          glVertex3dv(&dStack_60);
          glVertex3dv(&dStack_48);
          glVertex3dv(&dStack_100);
          glVertex3dv(&dStack_60);
          iVar10 = iVar10 + 1;
        } while (iVar10 != 9);
        uVar12 = uVar13;
      } while (uVar13 != 3);
      glEnd();
      if ((pXStack_d0->transformedMode == false) || (pXStack_d0->objectMode == true)) {
        drawCenterHandle(pXStack_d0);
      }
      glLineWidth(0x3f800000);
    }
    return;
  }
  if ((this->target).object != (SceneObject *)0x0) {
    dStack_b0 = (this->center).x;
    dStack_b8 = (this->center).y;
    dVar16 = (this->bounds).max.x - (this->bounds).min.x;
    dVar17 = (this->bounds).max.y - (this->bounds).min.y;
    dStack_c0 = (this->center).z;
    dVar15 = (this->bounds).max.z - (this->bounds).min.z;
    dVar15 = dVar15 * dVar15 + dVar16 * dVar16 + dVar17 * dVar17;
    if (dVar15 < 0.0) {
      dStack_f0 = 7.53101793627583e-318;
      dVar15 = sqrt(dVar15);
    }
    else {
      dVar15 = SQRT(dVar15);
    }
    dStack_c8 = dVar15 * 0.5;
    dStack_f0 = 7.53115133400021e-318;
    glLineWidth(0x41000000);
    dStack_f0 = 7.53120074056479e-318;
    glBegin(1);
    uVar12 = 0;
    do {
      uVar14 = uVar12 + 1;
      uVar13 = 0;
      if (uVar14 != 3) {
        uVar13 = uVar14 & 0xffffffff;
      }
      pVVar8 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dStack_80 = pVVar8[uVar13].x;
      dStack_88 = pVVar8[uVar13].y;
      dStack_90 = pVVar8[uVar13].z;
      uVar9 = ((int)uVar12 + 2U) % 3;
      dStack_98 = pVVar8[uVar9].x;
      dStack_a0 = pVVar8[uVar9].y;
      dStack_a8 = pVVar8[uVar9].z;
      dStack_f0 = 7.53207029610147e-318;
      glColor4ubv((this->axisColors).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar12].
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
      dStack_68 = 0.0;
      iVar10 = 1;
      do {
        dStack_70 = dStack_68 * 6.283185307179586 * 0.015625;
        dStack_68 = dStack_68 + 1.0;
        dStack_78 = (double)iVar10 * 6.283185307179586 * 0.015625;
        dStack_f0 = 7.53251495518273e-318;
        dVar15 = cos(dStack_70);
        pXStack_e0 = (XFormWidget *)(dStack_80 * dVar15);
        dStack_d8 = dStack_88 * dVar15;
        pXStack_d0 = (XFormWidget *)(dVar15 * dStack_90);
        dStack_f0 = 7.53278669128794e-318;
        dVar15 = sin(dStack_70);
        dStack_48 = ((double)pXStack_e0 - dStack_98 * dVar15) * dStack_c8 + dStack_b0;
        dStack_40 = (dStack_d8 - dStack_a0 * dVar15) * dStack_c8 + dStack_b8;
        dStack_38 = ((double)pXStack_d0 - dVar15 * dStack_a8) * dStack_c8 + dStack_c0;
        dStack_f0 = 7.53344873925337e-318;
        dVar15 = cos(dStack_78);
        pXStack_e0 = (XFormWidget *)(dStack_80 * dVar15);
        dStack_d8 = dStack_88 * dVar15;
        pXStack_d0 = (XFormWidget *)(dVar15 * dStack_90);
        dStack_f0 = 7.53372047535858e-318;
        dVar15 = sin(dStack_78);
        dStack_60 = ((double)pXStack_e0 - dStack_98 * dVar15) * dStack_c8 + dStack_b0;
        dStack_58 = (dStack_d8 - dStack_a0 * dVar15) * dStack_c8 + dStack_b8;
        dStack_50 = ((double)pXStack_d0 - dVar15 * dStack_a8) * dStack_c8 + dStack_c0;
        dStack_f0 = 7.53436770135463e-318;
        glVertex3dv(&dStack_48);
        dStack_f0 = 7.5344072266063e-318;
        glVertex3dv(&dStack_60);
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0x41);
      uVar12 = uVar14;
    } while (uVar14 != 3);
    dStack_f0 = 7.53458014958234e-318;
    glEnd();
    dStack_f0 = 7.53461967483401e-318;
    drawCenterHandle(this);
    dStack_f0 = 7.53468390336797e-318;
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawHandles() const
{
   switch( mode )
   {
      case Mode::Translate:
         drawTranslateHandles();
         break;
      case Mode::Rotate:
         drawRotateHandles();
         break;
      case Mode::Scale:
         drawScaleHandles();
         break;
      default:
         break;
   }
}